

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O0

void __thiscall ErrTest_ClearError_Test::~ErrTest_ClearError_Test(ErrTest_ClearError_Test *this)

{
  ErrTest_ClearError_Test *this_local;
  
  ~ErrTest_ClearError_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ErrTest, ClearError) {
  ASSERT_EQ(0u, ERR_get_error())
      << "ERR_get_error returned value before an error was added.";

  ERR_put_error(1, 0 /* unused */, 2, "test", 4);
  ERR_clear_error();

  // The error queue should be cleared.
  EXPECT_EQ(0u, ERR_get_error());
}